

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O0

ACT_TYPE __thiscall
despot::MeanMDPPolicy::Action
          (MeanMDPPolicy *this,vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,
          RandomStreams *streams,History *history)

{
  ACT_TYPE AVar1;
  ChainState *this_00;
  int num_mdp_actions_00;
  ChainState *this_01;
  size_type sVar2;
  const_reference ppSVar3;
  reference pvVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  ACT_TYPE action;
  double prob;
  int local_78;
  int state2_1;
  ACT_TYPE action_2;
  int state1_1;
  double prob2;
  double prob1;
  int local_58;
  int state2;
  ACT_TYPE action_1;
  int state1;
  ChainState *state;
  State *particle;
  int i;
  ChainState *mean;
  int num_mdp_actions;
  int num_mdp_states;
  History *history_local;
  RandomStreams *streams_local;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *particles_local;
  MeanMDPPolicy *this_local;
  
  num_mdp_actions_00 = (**(code **)(*(long *)this->chain_model_ + 0x28))();
  this_01 = (ChainState *)
            (**(code **)(*(long *)this->chain_model_ + 0xa8))
                      (0x3ff0000000000000,this->chain_model_,0xffffffff);
  ChainState::Init(this_01,5,num_mdp_actions_00);
  particle._4_4_ = 0;
  while( true ) {
    sVar2 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size(particles);
    if (sVar2 <= (ulong)(long)particle._4_4_) break;
    ppSVar3 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                        (particles,(long)particle._4_4_);
    this_00 = (ChainState *)*ppSVar3;
    for (state2 = 0; state2 < 5; state2 = state2 + 1) {
      for (local_58 = 0; local_58 < num_mdp_actions_00; local_58 = local_58 + 1) {
        for (prob1._4_4_ = 0; prob1._4_4_ < 5; prob1._4_4_ = prob1._4_4_ + 1) {
          dVar5 = ChainState::GetTransition(this_01,state2,local_58,prob1._4_4_);
          dVar6 = ChainState::GetTransition(this_00,state2,local_58,prob1._4_4_);
          ChainState::SetTransition(this_01,state2,local_58,prob1._4_4_,dVar5 + dVar6);
        }
      }
    }
    particle._4_4_ = particle._4_4_ + 1;
  }
  for (state2_1 = 0; state2_1 < 5; state2_1 = state2_1 + 1) {
    for (local_78 = 0; local_78 < num_mdp_actions_00; local_78 = local_78 + 1) {
      for (prob._4_4_ = 0; prob._4_4_ < 5; prob._4_4_ = prob._4_4_ + 1) {
        dVar5 = ChainState::GetTransition(this_01,state2_1,local_78,prob._4_4_);
        sVar2 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size(particles);
        auVar7._8_4_ = (int)(sVar2 >> 0x20);
        auVar7._0_8_ = sVar2;
        auVar7._12_4_ = 0x45300000;
        ChainState::SetTransition
                  (this_01,state2_1,local_78,prob._4_4_,
                   dVar5 / ((auVar7._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)));
      }
    }
  }
  Chain::ComputeOptimalValue(this->chain_model_,this_01);
  ppSVar3 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[](particles,0);
  pvVar4 = std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::operator[]
                     (&this_01->policy,(long)*(int *)(*ppSVar3 + 0x38));
  AVar1 = *(ACT_TYPE *)pvVar4;
  (**(code **)(*(long *)this->chain_model_ + 0xb8))(this->chain_model_,this_01);
  return AVar1;
}

Assistant:

ACT_TYPE Action(const vector<State*>& particles, RandomStreams& streams,
		History& history) const {
		int num_mdp_states = chain_model_->NUM_MDP_STATES, num_mdp_actions =
			chain_model_->NumActions();

		ChainState* mean = static_cast<ChainState*>(chain_model_->Allocate(-1,
			1.0));
		mean->Init(num_mdp_states, num_mdp_actions);

		// mean->mdp_state = cur_state_;
		for (int i = 0; i < particles.size(); i++) {
			State* particle = particles[i];
			ChainState* state = static_cast<ChainState*>(particle);
			for (int state1 = 0; state1 < num_mdp_states; state1++) {
				for (ACT_TYPE action = 0; action < num_mdp_actions; action++) {
					for (int state2 = 0; state2 < num_mdp_states; state2++) {
						double prob1 = mean->GetTransition(state1, action,
							state2);
						double prob2 = state->GetTransition(state1, action,
							state2);
						mean->SetTransition(state1, action, state2,
							prob1 + prob2);
					}
				}
			}
		}

		for (int state1 = 0; state1 < num_mdp_states; state1++) {
			for (ACT_TYPE action = 0; action < num_mdp_actions; action++) {
				for (int state2 = 0; state2 < num_mdp_states; state2++) {
					double prob = mean->GetTransition(state1, action, state2);
					mean->SetTransition(state1, action, state2,
						prob / particles.size());
				}
			}
		}

		chain_model_->ComputeOptimalValue(*mean);

		ACT_TYPE action =
			mean->policy[static_cast<ChainState*>(particles[0])->mdp_state].action;
		chain_model_->Free(mean);
		return action;
	}